

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzset_unlocked.c
# Opt level: O0

void scrub_abbrs(state *sp)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *cp;
  ttinfo *ttisp;
  int i;
  state *sp_local;
  
  for (ttisp._4_4_ = 0; ttisp._4_4_ < sp->charcnt; ttisp._4_4_ = ttisp._4_4_ + 1) {
    pcVar2 = strchr("abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789 :+-._",
                    (int)sp->chars[ttisp._4_4_]);
    if (pcVar2 == (char *)0x0) {
      sp->chars[ttisp._4_4_] = '_';
    }
  }
  for (ttisp._4_4_ = 0; ttisp._4_4_ < sp->typecnt; ttisp._4_4_ = ttisp._4_4_ + 1) {
    pcVar2 = sp->chars + sp->ttis[ttisp._4_4_].desigidx;
    sVar3 = strlen(pcVar2);
    if (0x10 < sVar3) {
      iVar1 = strcmp(pcVar2,"Local time zone must be set--see zic manual page");
      if (iVar1 != 0) {
        pcVar2[0x10] = '\0';
      }
    }
  }
  return;
}

Assistant:

static void scrub_abbrs( struct state * sp )
{
    int i;

    /* First, replace bogus characters. */
    for ( i = 0; i < sp->charcnt; ++i )
    {
        if ( strchr( TZ_ABBR_CHAR_SET, sp->chars[ i ] ) == NULL )
        {
            sp->chars[ i ] = TZ_ABBR_ERR_CHAR;
        }
    }

    /* Second, truncate long abbreviations. */
    for ( i = 0; i < sp->typecnt; ++i )
    {
        const struct ttinfo * const ttisp = &sp->ttis[ i ];
        char * cp = &sp->chars[ ttisp->desigidx ];

        if ( strlen( cp ) > TZ_ABBR_MAX_LEN && strcmp( cp, GRANDPARENTED ) != 0 )
        {
            *( cp + TZ_ABBR_MAX_LEN ) = '\0';
        }
    }
}